

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O1

byte * COSE_Encrypt_GetContent(HCOSE_ENCRYPT h,size_t *pcbContent,cose_errback *perror)

{
  _Bool _Var1;
  byte *pbVar2;
  COSE_Encrypt *p;
  
  _Var1 = _COSE_IsInList(EncryptRoot,(COSE *)h);
  if ((pcbContent == (size_t *)0x0) || (!_Var1)) {
    if (perror != (cose_errback *)0x0) {
      perror->err = COSE_ERR_INVALID_PARAMETER;
    }
    pbVar2 = (byte *)0x0;
  }
  else {
    *pcbContent = *(size_t *)(h + 0x60);
    pbVar2 = *(byte **)(h + 0x58);
  }
  return pbVar2;
}

Assistant:

const byte * COSE_Encrypt_GetContent(HCOSE_ENCRYPT h, size_t * pcbContent, cose_errback * perror)
{
    COSE_Encrypt * cose = (COSE_Encrypt *) h;
    if (!IsValidEncryptHandle(h) || (pcbContent == NULL)) {
        if (perror != NULL) perror->err = COSE_ERR_INVALID_PARAMETER;
        return false;
    }

    *pcbContent = cose->cbContent;
    return cose->pbContent;
}